

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_text.c
# Opt level: O0

size_t log_policy_format_text_deserialize
                 (log_policy policy,log_record record,void *buffer,size_t size)

{
  size_t in_RCX;
  log_policy in_RDI;
  log_policy_format_text_data text_data;
  
  log_policy_instance(in_RDI);
  return in_RCX;
}

Assistant:

static size_t log_policy_format_text_deserialize(log_policy policy, log_record record, const void *buffer, const size_t size)
{
	log_policy_format_text_data text_data = log_policy_instance(policy);

	/* TODO */
	(void)text_data;
	(void)record;
	(void)buffer;
	(void)size;

	return size;
}